

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TmpFile.h
# Opt level: O0

void __thiscall TmpFile::TmpFile(TmpFile *this)

{
  ostream *this_00;
  void *this_01;
  int local_220;
  int i;
  ostream local_210 [8];
  ofstream file;
  TmpFile *this_local;
  
  generateTmpname_abi_cxx11_();
  std::ofstream::ofstream(local_210,this,0x10);
  for (local_220 = 0; local_220 < 1000; local_220 = local_220 + 1) {
    this_00 = std::operator<<(local_210,"This is line #");
    this_01 = (void *)std::ostream::operator<<(this_00,local_220);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

TmpFile() {
        std::ofstream file(name_);
        for(int i = 0; i < 1000; i++) {
            file << "This is line #" << i << std::endl;
        }
    }